

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

int send_http_sas_request
              (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_client,
              HTTPAPIEX_HANDLE http_api_handle,char *relative_path,
              HTTP_HEADERS_HANDLE request_header,BUFFER_HANDLE blobBuffer,
              BUFFER_HANDLE response_buff)

{
  HTTPAPIEX_RESULT HVar1;
  char *key;
  LOGGER_LOG p_Var2;
  uint *statusCode_00;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG p_Stack_68;
  uint statusCode;
  LOGGER_LOG l_1;
  HTTPAPIEX_SAS_HANDLE http_sas_handle;
  char *uriResourceCharPtr;
  LOGGER_LOG l;
  STRING_HANDLE uri_resource;
  BUFFER_HANDLE pBStack_38;
  int result;
  BUFFER_HANDLE response_buff_local;
  BUFFER_HANDLE blobBuffer_local;
  HTTP_HEADERS_HANDLE request_header_local;
  char *relative_path_local;
  HTTPAPIEX_HANDLE http_api_handle_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_client_local;
  undefined4 uVar3;
  
  pBStack_38 = response_buff;
  response_buff_local = blobBuffer;
  blobBuffer_local = (BUFFER_HANDLE)request_header;
  request_header_local = (HTTP_HEADERS_HANDLE)relative_path;
  relative_path_local = (char *)http_api_handle;
  http_api_handle_local = (HTTPAPIEX_HANDLE)upload_client;
  l = (LOGGER_LOG)
      STRING_construct_sprintf("%s/devices/%s",upload_client->hostname,upload_client->deviceId);
  if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
    uriResourceCharPtr = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)uriResourceCharPtr != (LOGGER_LOG)0x0) {
      (*(code *)uriResourceCharPtr)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"send_http_sas_request",0x6a,1,"Failure constructing uri string");
    }
    uri_resource._4_4_ = 0x6b;
  }
  else {
    http_sas_handle = (HTTPAPIEX_SAS_HANDLE)STRING_c_str((STRING_HANDLE)l);
    key = IoTHubClient_Auth_Get_DeviceKey
                    ((IOTHUB_AUTHORIZATION_HANDLE)http_api_handle_local->httpHandle);
    l_1 = (LOGGER_LOG)HTTPAPIEX_SAS_Create_From_String(key,(char *)http_sas_handle,"");
    if ((HTTPAPIEX_SAS_HANDLE)l_1 == (HTTPAPIEX_SAS_HANDLE)0x0) {
      p_Stack_68 = xlogging_get_log_function();
      if (p_Stack_68 != (LOGGER_LOG)0x0) {
        (*p_Stack_68)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"send_http_sas_request",0x74,1,"unable to HTTPAPIEX_SAS_Create");
      }
      uri_resource._4_4_ = 0x75;
    }
    else {
      l_2._4_4_ = 0;
      statusCode_00 = (uint *)((long)&l_2 + 4);
      HVar1 = HTTPAPIEX_SAS_ExecuteRequest
                        ((HTTPAPIEX_SAS_HANDLE)l_1,(HTTPAPIEX_HANDLE)relative_path_local,
                         HTTPAPI_REQUEST_POST,(char *)request_header_local,
                         (HTTP_HEADERS_HANDLE)blobBuffer_local,response_buff_local,statusCode_00,
                         (HTTP_HEADERS_HANDLE)0x0,pBStack_38);
      uVar3 = (undefined4)((ulong)statusCode_00 >> 0x20);
      if (HVar1 == HTTPAPIEX_OK) {
        if ((l_2._4_4_ < 100) || (299 < l_2._4_4_)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"send_http_sas_request",0x84,1,"HTTP failed response code was %u",
                      CONCAT44(uVar3,l_2._4_4_));
          }
          uri_resource._4_4_ = 0x85;
        }
        else {
          uri_resource._4_4_ = 0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"send_http_sas_request",0x7f,1,"unable to HTTPAPIEX_SAS_ExecuteRequest");
        }
        uri_resource._4_4_ = 0x80;
      }
      HTTPAPIEX_SAS_Destroy((HTTPAPIEX_SAS_HANDLE)l_1);
    }
    STRING_delete((STRING_HANDLE)l);
  }
  return uri_resource._4_4_;
}

Assistant:

static int send_http_sas_request(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_client, HTTPAPIEX_HANDLE http_api_handle, const char* relative_path, HTTP_HEADERS_HANDLE request_header, BUFFER_HANDLE blobBuffer, BUFFER_HANDLE response_buff)
{
    int result;
    STRING_HANDLE uri_resource = STRING_construct_sprintf("%s/devices/%s", upload_client->hostname, upload_client->deviceId);

    if (uri_resource == NULL)
    {
        LogError("Failure constructing uri string");
        result = MU_FAILURE;
    }
    else
    {
        const char* uriResourceCharPtr = STRING_c_str(uri_resource);
        HTTPAPIEX_SAS_HANDLE http_sas_handle = HTTPAPIEX_SAS_Create_From_String(IoTHubClient_Auth_Get_DeviceKey(upload_client->authorization_module), uriResourceCharPtr, EMPTY_STRING);

        if (http_sas_handle == NULL)
        {
            LogError("unable to HTTPAPIEX_SAS_Create");
            result = MU_FAILURE;
        }
        else
        {
            unsigned int statusCode = 0;

            if (HTTPAPIEX_SAS_ExecuteRequest(
                http_sas_handle, http_api_handle, HTTPAPI_REQUEST_POST, relative_path, request_header,
                blobBuffer, &statusCode, NULL, response_buff) != HTTPAPIEX_OK)
            {
                LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                result = MU_FAILURE;
            }
            else if (!IS_HTTP_STATUS_CODE_SUCCESS(statusCode))
            {
                LogError("HTTP failed response code was %u", statusCode);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            HTTPAPIEX_SAS_Destroy(http_sas_handle);
        }

        STRING_delete(uri_resource);
    }

    return result;
}